

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * inverse(Clifford *__return_storage_ptr__,Clifford *A)

{
  bool bVar1;
  float fVar2;
  Clifford xb;
  Clifford inv;
  Clifford temp;
  Clifford local_130;
  vector<Blade,_std::allocator<Blade>_> local_118;
  vector<Blade,_std::allocator<Blade>_> local_100;
  vector<Blade,_std::allocator<Blade>_> local_e8;
  Clifford local_d0;
  vector<Blade,_std::allocator<Blade>_> local_b8;
  vector<Blade,_std::allocator<Blade>_> local_a0;
  Clifford local_88;
  vector<Blade,_std::allocator<Blade>_> local_70;
  vector<Blade,_std::allocator<Blade>_> local_58;
  vector<Blade,_std::allocator<Blade>_> local_40;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_58,A);
  if (local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    fVar2 = 0.0;
  }
  else {
    fVar2 = (local_58.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
             super__Vector_impl_data._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_40,A);
  bVar1 = isScalar(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  if (bVar1) {
    (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Blade::Blade((Blade *)&local_130,0,1.0 / fVar2);
    std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
              (__return_storage_ptr__,(Blade *)&local_130);
    Blade::~Blade((Blade *)&local_130);
  }
  else {
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_70,A);
    operator!(&local_130,&local_70);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_70);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_a0,A);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_b8,&local_130);
    operator|(&local_88,&local_a0,&local_b8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a0);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_e8,&local_88);
    inverse(&local_d0,&local_e8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_e8);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_100,&local_130);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_118,&local_d0);
    operator*(__return_storage_ptr__,&local_100,&local_118);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_118);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_100);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford inverse(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		Clifford result;
		result.push_back(Blade(0, 1.0 / sk));
		return result;
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	Clifford inv = inverse(temp);
	return (xb*inv);
}